

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PMap * NewMap(PType *keytype,PType *valuetype)

{
  PClass *len;
  PMap *local_28;
  PType *maptype;
  size_t bucket;
  PType *valuetype_local;
  PType *keytype_local;
  
  len = PMap::RegistrationInfo.MyClass;
  bucket = (size_t)valuetype;
  valuetype_local = keytype;
  local_28 = (PMap *)FTypeTable::FindType
                               (&TypeTable,PMap::RegistrationInfo.MyClass,(intptr_t)keytype,
                                (intptr_t)valuetype,(size_t *)&maptype);
  if (local_28 == (PMap *)0x0) {
    local_28 = (PMap *)DObject::operator_new((DObject *)0x90,(size_t)len);
    PMap::PMap(local_28,valuetype_local,(PType *)bucket);
    FTypeTable::AddType(&TypeTable,(PType *)local_28,PMap::RegistrationInfo.MyClass,
                        (intptr_t)valuetype_local,bucket,(size_t)maptype);
  }
  return local_28;
}

Assistant:

PMap *NewMap(PType *keytype, PType *valuetype)
{
	size_t bucket;
	PType *maptype = TypeTable.FindType(RUNTIME_CLASS(PMap), (intptr_t)keytype, (intptr_t)valuetype, &bucket);
	if (maptype == NULL)
	{
		maptype = new PMap(keytype, valuetype);
		TypeTable.AddType(maptype, RUNTIME_CLASS(PMap), (intptr_t)keytype, (intptr_t)valuetype, bucket);
	}
	return (PMap *)maptype;
}